

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall front::irGenerator::irGenerator::ir_end_of_program(irGenerator *this)

{
  pointer pcVar1;
  string returnTmp;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e0;
  bool local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  
  getNewTmpValueName_abi_cxx11_(&local_78,this,Int);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  pcVar1 = (this->_GlobalInitFuncName)._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (this->_GlobalInitFuncName)._M_string_length);
  getFunctionName(&local_58,this,&local_b8);
  local_38.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ir_function_call(this,&local_98,INT,&local_58,&local_38,false);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_e0._M_value + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  local_c0 = true;
  ir_jump(this,Return,-1,-1,
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e0,Undefined);
  if (local_c0 == true) {
    local_c0 = false;
    if (local_e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e0._M_value + 0x10)) {
      operator_delete((void *)local_e0._M_value._M_dataplus._M_p,local_e0._16_8_ + 1);
    }
  }
  ir_leave_function(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void irGenerator::ir_end_of_program() {
  string returnTmp = getNewTmpValueName(mir::types::TyKind::Int);
  ir_function_call(returnTmp, front::symbol::SymbolKind::INT,
                   getFunctionName(_GlobalInitFuncName), {});
  ir_jump(mir::inst::JumpInstructionKind::Return, -1, -1, returnTmp,
          mir::inst::JumpKind::Undefined);
  ir_leave_function();
}